

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void prepvarinfo(rnndb *db,char *what,rnnvarinfo *vi,rnnvarinfo *parent)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  rnnenum *prVar5;
  rnnvarset **pprVar6;
  rnnvarset *prVar7;
  char *pcVar8;
  ulong uVar9;
  int *piVar10;
  char *name;
  rnnvalue *prVar11;
  uint uVar12;
  ulong uVar13;
  byte *pbVar14;
  size_t __n;
  ulong uVar15;
  byte *pbVar16;
  long lVar17;
  byte *__string;
  bool bVar18;
  
  if (parent != (rnnvarinfo *)0x0) {
    vi->prefenum = parent->prefenum;
  }
  pcVar8 = vi->prefixstr;
  if (pcVar8 != (char *)0x0) {
    iVar3 = strcmp(pcVar8,"none");
    if (iVar3 == 0) {
      prVar5 = (rnnenum *)0x0;
    }
    else {
      prVar5 = rnn_findenum(db,pcVar8);
    }
    vi->prefenum = prVar5;
  }
  if (parent != (rnnvarinfo *)0x0) {
    for (lVar17 = 0; lVar17 < parent->varsetsnum; lVar17 = lVar17 + 1) {
      iVar3 = vi->varsetsmax;
      if (iVar3 <= vi->varsetsnum) {
        iVar4 = iVar3 * 2;
        if (iVar3 == 0) {
          iVar4 = 0x10;
        }
        vi->varsetsmax = iVar4;
        pprVar6 = (rnnvarset **)realloc(vi->varsets,(long)iVar4 << 3);
        vi->varsets = pprVar6;
      }
      prVar7 = copyvarset(parent->varsets[lVar17]);
      iVar3 = vi->varsetsnum;
      vi->varsetsnum = iVar3 + 1;
      vi->varsets[iVar3] = prVar7;
    }
  }
  pcVar8 = vi->varsetstr;
  prVar5 = vi->prefenum;
  if (((prVar5 == (rnnenum *)0x0) && (parent != (rnnvarinfo *)0x0)) && (pcVar8 == (char *)0x0)) {
    if (parent->varsetstr == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = strdup(parent->varsetstr);
    }
    vi->varsetstr = pcVar8;
  }
  if (pcVar8 != (char *)0x0) {
    prVar5 = rnn_findenum(db,pcVar8);
  }
  __string = (byte *)vi->variantsstr;
  if (__string == (byte *)0x0) {
LAB_001065da:
    if ((vi->dead == 0) && (prVar5 = vi->prefenum, prVar5 != (rnnenum *)0x0)) {
      uVar13 = 0;
      uVar9 = (ulong)(uint)vi->varsetsnum;
      if (vi->varsetsnum < 1) {
        uVar9 = uVar13;
      }
      do {
        if (uVar9 == uVar13) {
          prVar11 = *prVar5->vals;
          goto LAB_0010663b;
        }
        pprVar6 = vi->varsets + uVar13;
        uVar13 = uVar13 + 1;
      } while ((*pprVar6)->venum != prVar5);
      uVar13 = 0;
      uVar9 = (ulong)(uint)prVar5->valsnum;
      if (prVar5->valsnum < 1) {
        uVar9 = uVar13;
      }
      do {
        uVar15 = uVar13;
        if (uVar9 == uVar15) {
          return;
        }
        uVar13 = uVar15 + 1;
      } while ((*pprVar6)->variants[uVar15] == 0);
      prVar11 = prVar5->vals[uVar15];
LAB_0010663b:
      pcVar8 = strdup(prVar11->name);
      vi->prefix = pcVar8;
    }
  }
  else {
    if (prVar5 != (rnnenum *)0x0) {
      uVar2 = prVar5->valsnum;
      uVar12 = vi->varsetsnum;
      uVar9 = 0;
      uVar13 = 0;
      if (0 < (int)uVar12) {
        uVar13 = (ulong)uVar12;
      }
LAB_001063b6:
      if (uVar13 != uVar9) goto code_r0x001063bb;
      prVar7 = (rnnvarset *)calloc(0x10,1);
      prVar7->venum = prVar5;
      piVar10 = (int *)calloc(4,(long)(int)uVar2);
      prVar7->variants = piVar10;
      uVar13 = 0;
      uVar9 = 0;
      if (0 < (int)uVar2) {
        uVar9 = (ulong)uVar2;
      }
      for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
        piVar10[uVar13] = 1;
      }
      iVar3 = vi->varsetsmax;
      pprVar6 = vi->varsets;
      if (iVar3 <= (int)uVar12) {
        iVar4 = iVar3 * 2;
        if (iVar3 == 0) {
          iVar4 = 0x10;
        }
        vi->varsetsmax = iVar4;
        pprVar6 = (rnnvarset **)realloc(pprVar6,(long)iVar4 << 3);
        vi->varsets = pprVar6;
        uVar12 = vi->varsetsnum;
      }
      vi->varsetsnum = uVar12 + 1;
      pprVar6[(int)uVar12] = prVar7;
LAB_00106466:
      while( true ) {
        for (; bVar1 = *__string, bVar1 == 0x20; __string = __string + 1) {
        }
        pbVar14 = __string;
        pbVar16 = __string;
        if (bVar1 == 0) break;
        while( true ) {
          pbVar16 = pbVar16 + 1;
          if ((bVar1 < 0x3b) && ((0x400200100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
          bVar1 = pbVar14[1];
          pbVar14 = pbVar14 + 1;
        }
        if ((long)pbVar14 - (long)__string == 0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = strndup((char *)__string,(long)pbVar14 - (long)__string);
        }
        if ((bVar1 & 0xdf) == 0) {
          iVar3 = findvidx(db,prVar5,pcVar8);
          if (iVar3 != -1) {
            prVar7->variants[iVar3] = prVar7->variants[iVar3] | 2;
          }
        }
        else {
          __n = 0;
          for (; (*pbVar16 & 0xdf) != 0; pbVar16 = pbVar16 + 1) {
            __n = __n + 1;
          }
          if (__n == 0) {
            name = (char *)0x0;
          }
          else {
            name = strndup((char *)(pbVar14 + 1),__n);
          }
          if (pcVar8 == (char *)0x0) {
            iVar3 = 0;
          }
          else {
            iVar3 = findvidx(db,prVar5,pcVar8);
          }
          uVar12 = uVar2;
          if (name != (char *)0x0) {
            iVar4 = findvidx(db,prVar5,name);
            uVar12 = (uint)(*pbVar14 == 0x2d) + iVar4;
          }
          if ((iVar3 != -1) && (uVar12 != 0xffffffff)) {
            for (lVar17 = (long)iVar3; lVar17 < (int)uVar12; lVar17 = lVar17 + 1) {
              prVar7->variants[lVar17] = prVar7->variants[lVar17] | 2;
            }
          }
          free(name);
          pbVar14 = pbVar16;
        }
        free(pcVar8);
        __string = pbVar14;
      }
      vi->dead = 1;
      uVar13 = 0;
      uVar9 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar9 = uVar13;
      }
      for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
        bVar18 = prVar7->variants[uVar13] == 3;
        prVar7->variants[uVar13] = (uint)bVar18;
        if (bVar18) {
          vi->dead = 0;
        }
      }
      goto LAB_001065da;
    }
    fprintf(_stderr,"%s: tried to use variants without active varset!\n",what);
    db->estatus = 1;
  }
  return;
code_r0x001063bb:
  prVar7 = vi->varsets[uVar9];
  uVar9 = uVar9 + 1;
  if (prVar7->venum == prVar5) goto LAB_00106466;
  goto LAB_001063b6;
}

Assistant:

static void prepvarinfo (struct rnndb *db, char *what, struct rnnvarinfo *vi, struct rnnvarinfo *parent) {
	if (parent)
		vi->prefenum = parent->prefenum;
	if (vi->prefixstr) {
		if (!strcmp(vi->prefixstr, "none"))
			vi->prefenum = 0;
		else
			vi->prefenum = rnn_findenum(db, vi->prefixstr); // XXX
	}
	int i;
	if (parent)
		for (i = 0; i < parent->varsetsnum; i++)
			ADDARRAY(vi->varsets, copyvarset(parent->varsets[i]));
	struct rnnenum *varset = vi->prefenum;
	if (!varset && !vi->varsetstr && parent)
		vi->varsetstr = parent->varsetstr ? strdup(parent->varsetstr) : NULL;
	if (vi->varsetstr)
		varset = rnn_findenum(db, vi->varsetstr);
	if (vi->variantsstr) {
		char *vars = vi->variantsstr;
		if (!varset) {
			fprintf (stderr, "%s: tried to use variants without active varset!\n", what);
			db->estatus = 1;
			return;
		}
		struct rnnvarset *vs = 0;
		int nvars = varset->valsnum;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == varset) {
				vs = vi->varsets[i];
				break;
			}
		if (!vs) {
			vs = calloc (sizeof *vs, 1);
			vs->venum = varset;
			vs->variants = calloc(sizeof *vs->variants, nvars);
			for (i = 0; i < nvars; i++)
				vs->variants[i] = 1;
			ADDARRAY(vi->varsets, vs);
		}
		while (1) {
			while (*vars == ' ') vars++;
			if (*vars == 0)
				break;
			char *split = vars;
			while (*split != ':' && *split != '-' && *split != ' '  && *split != 0)
				split++;
			char *first = 0;
			if (split != vars)
				first = strndup(vars, split-vars);
			if (*split == ' ' || *split == 0) {
				int idx = findvidx(db, varset, first);
				if (idx != -1)
					vs->variants[idx] |= 2;
				vars = split;
			} else {
				char *end = split+1;
				while (*end != ' '  && *end != 0)
					end++;
				char *second = 0;
				if (end != split+1)
					second = strndup(split+1, end-split-1);
				int idx1 = 0;
				if (first)
					idx1 = findvidx(db, varset, first);
				int idx2 = nvars;
				if (second) {
					idx2 = findvidx(db, varset, second);
					if (*split == '-')
						idx2++;
				}
				if (idx1 != -1 && idx2 != -1)
					for (i = idx1; i < idx2; i++)
						vs->variants[i] |= 2;
				vars = end;
				free(second);
			}
			free(first);
		}
		vi->dead = 1;
		for (i = 0; i < nvars; i++) {
			vs->variants[i] = (vs->variants[i] == 3);
			if (vs->variants[i])
				vi->dead = 0;
		}
	}
	if (vi->dead)
		return;
	if (vi->prefenum) {
		struct rnnvarset *vs = 0;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == vi->prefenum) {
				vs = vi->varsets[i];
				break;
			}
		if (vs) {
			for (i = 0; i < vi->prefenum->valsnum; i++)
				if (vs->variants[i]) {
					vi->prefix = strdup(vi->prefenum->vals[i]->name);
					return;
				}
		} else {
			vi->prefix = strdup(vi->prefenum->vals[0]->name);
		}
	}
}